

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Value __thiscall wabt::interp::Instance::ResolveInitExpr(Instance *this,Store *store,InitExpr init)

{
  undefined4 val;
  Global *this_00;
  reference pvVar1;
  Value VVar2;
  Instance *local_68;
  u64 local_60;
  undefined1 local_50 [8];
  Ptr global;
  Store *store_local;
  Instance *this_local;
  Value result;
  
  val = init.field_1.i32_;
  switch(init.kind) {
  case None:
    abort();
  case I32:
    Value::Set<unsigned_int>((Value *)&this_local,val);
    break;
  case I64:
    Value::Set<unsigned_long>((Value *)&this_local,init.field_1.i64_);
    break;
  case F32:
    Value::Set<float>((Value *)&this_local,(f32)val);
    break;
  case F64:
    Value::Set<double>((Value *)&this_local,init.field_1.f64_);
    break;
  case V128:
    global.root_index_ = init.field_1.i64_;
    Value::Set<v128>((Value *)&this_local,init.field_1.v128_.v);
    break;
  case GlobalGet:
    pvVar1 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       (&this->globals_,(ulong)(uint)val);
    RefPtr<wabt::interp::Global>::RefPtr
              ((RefPtr<wabt::interp::Global> *)local_50,store,(Ref)pvVar1->index);
    this_00 = RefPtr<wabt::interp::Global>::operator->((RefPtr<wabt::interp::Global> *)local_50);
    VVar2 = Global::Get(this_00);
    local_68 = (Instance *)VVar2.i64_;
    this_local = local_68;
    local_60 = VVar2._8_8_;
    result.i64_ = local_60;
    RefPtr<wabt::interp::Global>::~RefPtr((RefPtr<wabt::interp::Global> *)local_50);
    break;
  case RefNull:
    Value::Set<wabt::interp::Ref>((Value *)&this_local,Ref::Null);
    break;
  case RefFunc:
    pvVar1 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       (&this->funcs_,(ulong)(uint)val);
    Value::Set<wabt::interp::Ref>((Value *)&this_local,(Ref)pvVar1->index);
  }
  VVar2._8_8_ = result.i64_;
  VVar2.i64_ = (u64)this_local;
  return VVar2;
}

Assistant:

Value Instance::ResolveInitExpr(Store& store, InitExpr init) {
  Value result;
  switch (init.kind) {
    case InitExprKind::I32:      result.Set(init.i32_); break;
    case InitExprKind::I64:      result.Set(init.i64_); break;
    case InitExprKind::F32:      result.Set(init.f32_); break;
    case InitExprKind::F64:      result.Set(init.f64_); break;
    case InitExprKind::V128:     result.Set(init.v128_); break;
    case InitExprKind::GlobalGet: {
      Global::Ptr global{store, globals_[init.index_]};
      result = global->Get();
      break;
    }
    case InitExprKind::RefFunc: {
      result.Set(funcs_[init.index_]);
      break;
    }
    case InitExprKind::RefNull:
      result.Set(Ref::Null);
      break;

    case InitExprKind::None:
      WABT_UNREACHABLE;
  }
  return result;
}